

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

int cookie_output(CookieInfo *c,char *dumphere)

{
  bool bVar1;
  int iVar2;
  void *__base;
  char *pcVar3;
  Cookie **array;
  uint j;
  uint i;
  char *format_ptr;
  FILE *pFStack_30;
  _Bool use_stdout;
  FILE *out;
  Cookie *co;
  char *dumphere_local;
  CookieInfo *c_local;
  
  bVar1 = false;
  if ((c == (CookieInfo *)0x0) || (c->numcookies == 0)) {
    c_local._4_4_ = 0;
  }
  else {
    remove_expired(c);
    if (c->numcookies == 0) {
      c_local._4_4_ = 0;
    }
    else {
      __base = (*Curl_cmalloc)(c->numcookies << 3);
      if (__base == (void *)0x0) {
        c_local._4_4_ = 1;
      }
      else {
        iVar2 = strcmp("-",dumphere);
        if (iVar2 == 0) {
          pFStack_30 = _stdout;
          bVar1 = true;
        }
        else {
          pFStack_30 = fopen64(dumphere,"w");
          if (pFStack_30 == (FILE *)0x0) {
            (*Curl_cfree)(__base);
            return 1;
          }
        }
        fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
              ,pFStack_30);
        array._0_4_ = 0;
        for (array._4_4_ = 0; array._4_4_ < 0x100; array._4_4_ = array._4_4_ + 1) {
          for (out = (FILE *)c->cookies[array._4_4_]; out != (FILE *)0x0; out = *(FILE **)out) {
            if (out->_IO_write_ptr != (char *)0x0) {
              *(FILE **)((long)__base + (ulong)(uint)array * 8) = out;
              array._0_4_ = (uint)array + 1;
            }
          }
        }
        qsort(__base,c->numcookies,8,cookie_sort_ct);
        for (array._4_4_ = 0; array._4_4_ < (uint)array; array._4_4_ = array._4_4_ + 1) {
          pcVar3 = get_netscape_format(*(Cookie **)((long)__base + (ulong)array._4_4_ * 8));
          if (pcVar3 == (char *)0x0) {
            curl_mfprintf((FILE *)pFStack_30,"#\n# Fatal libcurl error\n");
            (*Curl_cfree)(__base);
            if (!bVar1) {
              fclose(pFStack_30);
            }
            return 1;
          }
          curl_mfprintf((FILE *)pFStack_30,"%s\n",pcVar3);
          (*Curl_cfree)(pcVar3);
        }
        (*Curl_cfree)(__base);
        if (!bVar1) {
          fclose(pFStack_30);
        }
        c_local._4_4_ = 0;
      }
    }
  }
  return c_local._4_4_;
}

Assistant:

static int cookie_output(struct CookieInfo *c, const char *dumphere)
{
  struct Cookie *co;
  FILE *out;
  bool use_stdout = FALSE;
  char *format_ptr;
  unsigned int i;
  unsigned int j;
  struct Cookie **array;

  if((NULL == c) || (0 == c->numcookies))
    /* If there are no known cookies, we don't write or even create any
       destination file */
    return 0;

  /* at first, remove expired cookies */
  remove_expired(c);

  /* make sure we still have cookies after expiration */
  if(0 == c->numcookies)
    return 0;

  array = malloc(sizeof(struct Cookie *) * c->numcookies);
  if(!array)
    return 1;

  if(!strcmp("-", dumphere)) {
    /* use stdout */
    out = stdout;
    use_stdout = TRUE;
  }
  else {
    out = fopen(dumphere, FOPEN_WRITETEXT);
    if(!out) {
      free(array);
      return 1; /* failure */
    }
  }

  fputs("# Netscape HTTP Cookie File\n"
        "# https://curl.haxx.se/docs/http-cookies.html\n"
        "# This file was generated by libcurl! Edit at your own risk.\n\n",
        out);

  j = 0;
  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    for(co = c->cookies[i]; co; co = co->next) {
      if(!co->domain)
        continue;
      array[j++] = co;
    }
  }

  qsort(array, c->numcookies, sizeof(struct Cookie *), cookie_sort_ct);

  for(i = 0; i < j; i++) {
    format_ptr = get_netscape_format(array[i]);
    if(format_ptr == NULL) {
      fprintf(out, "#\n# Fatal libcurl error\n");
      free(array);
      if(!use_stdout)
        fclose(out);
      return 1;
    }
    fprintf(out, "%s\n", format_ptr);
    free(format_ptr);
  }

  free(array);

  if(!use_stdout)
    fclose(out);

  return 0;
}